

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_hitroll(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  char *txt;
  
  txt = "Syntax:  hitroll [number]\n\r";
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    bVar2 = is_number(argument);
    if (bVar2) {
      iVar3 = atoi(argument);
      *(short *)((long)pvVar1 + 0x9c) = (short)iVar3;
      bVar2 = true;
      txt = "Hitroll set.\n\r";
      goto LAB_00368ae5;
    }
  }
  bVar2 = false;
LAB_00368ae5:
  send_to_char(txt,ch);
  return bVar2;
}

Assistant:

bool medit_hitroll(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0' || !is_number(argument))
	{
		send_to_char("Syntax:  hitroll [number]\n\r", ch);
		return false;
	}

	pMob->hitroll = atoi(argument);
	send_to_char("Hitroll set.\n\r", ch);
	return true;
}